

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

size_t mserialize::detail::
       BuiltinSerializer<std::pair<std::pair<char,short>,std::pair<int,long>>,void>::
       serialized_size_impl<0ul,1ul>(long t)

{
  size_t sVar1;
  long lVar2;
  size_t (*__range3) [3];
  size_t elem_sizes [3];
  long local_28 [4];
  
  local_28[0] = 0;
  local_28[1] = BuiltinSerializer<std::pair<char,short>,void>::serialized_size_impl<0ul,1ul>();
  local_28[2] = BuiltinSerializer<std::pair<int,long>,void>::serialized_size_impl<0ul,1ul>(t + 8);
  sVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 8) {
    sVar1 = sVar1 + *(long *)((long)local_28 + lVar2);
  }
  return sVar1;
}

Assistant:

static std::size_t serialized_size_impl(const Tuple<E...>& t, std::index_sequence<I...>)
  {
    using std::get;
    const std::size_t elem_sizes[] = {0, mserialize::serialized_size(get<I>(t))...};

    std::size_t result = 0;
    for (auto s : elem_sizes) { result += s; }
    return result;
  }